

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryExpression.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::BinaryExpression::dump_abi_cxx11_
          (string *__return_storage_ptr__,BinaryExpression *this,int level)

{
  pointer pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint local_1c;
  BinaryExpression *pBStack_18;
  int level_local;
  BinaryExpression *this_local;
  
  local_1c = level;
  pBStack_18 = this;
  this_local = (BinaryExpression *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,(long)level,'\t',&local_c1);
  (*(this->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[7])(&local_f8);
  std::operator+(&local_a0,&local_c0,&local_f8);
  std::operator+(&local_80,&local_a0,": ");
  pEVar1 = std::
           unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ::operator->(&this->first);
  (*(pEVar1->super_Statement).super_ASTElement._vptr_ASTElement[3])
            (&local_118,pEVar1,(ulong)local_1c);
  std::operator+(&local_60,&local_80,&local_118);
  std::operator+(&local_40,&local_60," + ");
  pEVar1 = std::
           unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ::operator->(&this->second);
  (*(pEVar1->super_Statement).super_ASTElement._vptr_ASTElement[3])
            (&local_138,pEVar1,(ulong)local_1c);
  std::operator+(__return_storage_ptr__,&local_40,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::BinaryExpression::dump(int level) const {
    return std::string(level, '\t')+ get_dump_name() + ": "+first->dump(level)+" + "+second->dump(level);
}